

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::HandleExtremeFloatingPoint
                   (string *__return_storage_ptr__,string *val,bool add_float_suffix)

{
  bool bVar1;
  long lVar2;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  bVar1 = std::operator==(val,"nan");
  if (bVar1) {
    __s = "NAN";
    __a = &local_19;
  }
  else {
    bVar1 = std::operator==(val,"inf");
    if (bVar1) {
      __s = "INFINITY";
      __a = &local_1a;
    }
    else {
      bVar1 = std::operator==(val,"-inf");
      if (!bVar1) {
        if ((add_float_suffix) &&
           (((lVar2 = std::__cxx11::string::find((char *)val,0x3506c3), lVar2 != -1 ||
             (lVar2 = std::__cxx11::string::find((char *)val,0x34b8b8), lVar2 != -1)) ||
            (lVar2 = std::__cxx11::string::find((char *)val,0x3a5ac4), lVar2 != -1)))) {
          std::__cxx11::string::append((char *)val);
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)val);
        return __return_storage_ptr__;
      }
      __s = "-INFINITY";
      __a = &local_1b;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static string HandleExtremeFloatingPoint(string val, bool add_float_suffix) {
  if (val == "nan") {
    return "NAN";
  } else if (val == "inf") {
    return "INFINITY";
  } else if (val == "-inf") {
    return "-INFINITY";
  } else {
    // float strings with ., e or E need to have f appended
    if (add_float_suffix &&
        (val.find(".") != string::npos || val.find("e") != string::npos ||
         val.find("E") != string::npos)) {
      val += "f";
    }
    return val;
  }
}